

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# penguinv.cpp
# Opt level: O2

uint8_t penguinV::GetPixel(Image *image,uint32_t x,uint32_t y)

{
  bool bVar1;
  uint8_t uVar2;
  ImageTypeManager *this;
  FunctionTableHolder *pFVar3;
  imageException *this_00;
  ImageTypeManager *pIVar4;
  GetPixelForm1 p_Var5;
  allocator local_127;
  allocator local_126;
  allocator local_125;
  uint32_t local_124;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  ImageManager manager;
  
  this = ImageTypeManager::instance();
  pFVar3 = ImageTypeManager::functionTable(this,image->_type);
  p_Var5 = pFVar3->GetPixel;
  uVar2 = image->_type;
  if (p_Var5 == (GetPixelForm1)0x0) {
    bVar1 = ImageTypeManager::isIntertypeConversionEnabled(this);
    if (bVar1) {
      local_124 = y;
      ImageTypeManager::imageTypes
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&manager,this);
      for (pIVar4 = manager._registrator;
          pIVar4 != (ImageTypeManager *)
                    manager._input.
                    super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pIVar4 = (ImageTypeManager *)&(pIVar4->_functionTableMap)._M_t._M_impl.field_0x1) {
        pFVar3 = ImageTypeManager::functionTable
                           (this,*(uint8_t *)&(pIVar4->_functionTableMap)._M_t._M_impl);
        p_Var5 = pFVar3->GetPixel;
        if (p_Var5 != (GetPixelForm1)0x0) {
          uVar2 = *(uint8_t *)&(pIVar4->_functionTableMap)._M_t._M_impl;
          goto LAB_0011a1c9;
        }
      }
      p_Var5 = (GetPixelForm1)0x0;
LAB_0011a1c9:
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&manager);
      y = local_124;
      if (p_Var5 != (GetPixelForm1)0x0) goto LAB_0011a1df;
    }
    std::__cxx11::string::string((string *)&local_e0,"Function ",&local_125);
    std::__cxx11::string::string((string *)&local_100,"GetPixel",&local_126);
    std::operator+(&local_c0,&local_e0,&local_100);
    std::__cxx11::string::string((string *)&local_120," is not defined",&local_127);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&manager,
                   &local_c0,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_e0);
    this_00 = (imageException *)__cxa_allocate_exception(0x28);
    imageException::imageException(this_00,(char *)manager._registrator);
    __cxa_throw(this_00,&imageException::typeinfo,imageException::~imageException);
  }
LAB_0011a1df:
  manager._registrator = ImageTypeManager::instance();
  manager._input.
  super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  manager._input.
  super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  manager._input.
  super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  manager._output.
  super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  manager._output.
  super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  manager._output.
  super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  manager._inputClone.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  manager._inputClone.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  manager._inputClone.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  manager._outputClone.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  manager._outputClone.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  manager._outputClone.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  manager._type = uVar2;
  uVar2 = (*p_Var5)(image,x,y);
  anon_unknown.dwarf_a4e46::ImageManager::~ImageManager(&manager);
  return uVar2;
}

Assistant:

uint8_t GetPixel( const Image & image, uint32_t x, uint32_t y )
    {
        initialize( image, GetPixel );
        return func( image, x, y );
    }